

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O3

char queryparse::unescape_char(char escaped)

{
  runtime_error *this;
  int iVar1;
  undefined7 in_register_00000039;
  undefined8 uVar2;
  
  uVar2 = CONCAT71(in_register_00000039,escaped);
  iVar1 = (int)uVar2;
  if (iVar1 < 0x66) {
    if ((iVar1 != 0x22) && (iVar1 != 0x5c)) {
      if (iVar1 != 0x62) goto LAB_0018af93;
      uVar2 = 8;
    }
  }
  else if (iVar1 < 0x72) {
    if (iVar1 == 0x66) {
      uVar2 = 0xc;
    }
    else {
      if (iVar1 != 0x6e) {
LAB_0018af93:
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"unexpected escaped char");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar2 = 10;
    }
  }
  else if (iVar1 == 0x72) {
    uVar2 = 0xd;
  }
  else {
    if (iVar1 != 0x74) goto LAB_0018af93;
    uVar2 = 9;
  }
  return (char)uVar2;
}

Assistant:

constexpr char unescape_char(char escaped) {
    switch (escaped) {
        case '"':
            return '\"';
        case '\\':
            return '\\';
        case 'b':
            return '\b';
        case 'f':
            return '\f';
        case 'n':
            return '\n';
        case 'r':
            return '\r';
        case 't':
            return '\t';
        default:
            throw std::runtime_error("unexpected escaped char");
    }
}